

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small.c
# Opt level: O1

void small_alloc_create(small_alloc *alloc,slab_cache *cache,uint32_t objsize_min,uint granularity,
                       float alloc_factor,float *actual_alloc_factor)

{
  small_mempool *psVar1;
  uint8_t uVar2;
  undefined1 uVar3;
  slab_cache *cache_00;
  int iVar4;
  bool bVar5;
  byte bVar6;
  uint uVar7;
  uint uVar8;
  long lVar9;
  uint8_t uVar10;
  ulong uVar11;
  ulong uVar12;
  uint uVar13;
  ulong uVar14;
  small_mempool *pool;
  small_mempool *psVar15;
  uint uVar16;
  
  alloc->cache = cache;
  if ((granularity & granularity - 1) != 0) {
    __assert_fail("(alignment & (alignment - 1)) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/include/small/util.h"
                  ,0x7f,"size_t small_align(size_t, size_t)");
  }
  uVar3 = cache->order0_size_lb;
  alloc->objsize_max =
       -granularity &
       (granularity - 1) + ((int)(1L << (cache->order_max + uVar3 & 0x3f)) - 0x70U >> 7) * 8;
  if ((granularity & granularity - 1) == 0) {
    if ((alloc_factor <= 1.0) || (2.0 < alloc_factor)) {
      __assert_fail("alloc_factor > 1. && alloc_factor <= 2.",
                    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/small/small.c"
                    ,0x135,
                    "void small_alloc_create(struct small_alloc *, struct slab_cache *, uint32_t, unsigned int, float, float *)"
                   );
    }
    alloc->factor = alloc_factor;
    small_class_create(&alloc->small_class,granularity,alloc_factor,
                       (objsize_min + granularity) - 1 & -granularity,actual_alloc_factor);
    psVar1 = alloc->small_mempool_cache;
    uVar7 = 0;
    alloc->small_mempool_groups_size = 0;
    alloc->small_mempool_cache_size = 0;
    uVar8 = alloc->objsize_max;
    psVar15 = psVar1;
    if (uVar8 == 0) {
      lVar9 = -1;
    }
    else {
      bVar5 = true;
      uVar10 = '\0';
      uVar13 = 0;
      uVar14 = 0;
      do {
        uVar7 = uVar13 + 1;
        uVar16 = (alloc->small_class).effective_mask & uVar7;
        bVar6 = (byte)(alloc->small_class).effective_bits & 0x1f;
        if (uVar7 >> bVar6 == 0) {
          bVar6 = (byte)(0 >> bVar6);
        }
        else {
          bVar6 = (char)(uVar7 >> bVar6) - 1;
          uVar16 = uVar16 | (alloc->small_class).effective_size;
        }
        uVar7 = ((uVar16 << (bVar6 & 0x1f)) << ((byte)(alloc->small_class).ignore_bits_count & 0x1f)
                ) + (alloc->small_class).size_shift;
        if (uVar8 <= uVar7) {
          uVar7 = uVar8;
        }
        uVar8 = 0x70;
        if (0x70 < uVar7) {
          uVar8 = uVar7;
        }
        cache_00 = alloc->cache;
        uVar11 = (ulong)((double)uVar8 / 0.01);
        uVar11 = (long)((double)uVar8 / 0.01 - 9.223372036854776e+18) & (long)uVar11 >> 0x3f |
                 uVar11;
        uVar12 = (ulong)cache_00->arena->slab_size;
        if (uVar12 <= uVar11) {
          uVar11 = uVar12;
        }
        if (cache_00->order0_size < uVar11) {
          uVar8 = (int)uVar11 - 1;
          iVar4 = 0x1f;
          if (uVar8 != 0) {
            for (; uVar8 >> iVar4 == 0; iVar4 = iVar4 + -1) {
            }
          }
          bVar6 = 0x20 - (((byte)iVar4 ^ 0x1f) + cache_00->order0_size_lb);
        }
        else {
          bVar6 = 0;
        }
        if (cache_00->order_max < bVar6) {
          __assert_fail("order <= cache->order_max",
                        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/include/small/mempool.h"
                        ,0xfe,"void mempool_create(struct mempool *, struct slab_cache *, uint32_t)"
                       );
        }
        pool = psVar1 + uVar13;
        mempool_create_with_order(&pool->pool,cache_00,uVar7,bVar6);
        *(small_mempool **)((long)&pool->pool + 0x68) = pool;
        pool->objsize_min = uVar14 + 1;
        pool->waste = 0;
        pool->group = (small_mempool_group *)0x0;
        pool->used_pool = (small_mempool *)0x0;
        pool->appropriate_pool_mask = 0;
        if (bVar5) {
          uVar10 = (pool->pool).slab_order;
          bVar5 = false;
        }
        uVar2 = (pool->pool).slab_order;
        if (uVar10 != uVar2) {
          if ((psVar15->pool).slab_ptr_mask != pool[-1].pool.slab_ptr_mask) {
            __assert_fail("cur_order_pool->pool.slab_ptr_mask == (pool - 1)->pool.slab_ptr_mask",
                          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/small/small.c"
                          ,0x116,"void small_mempool_create(struct small_alloc *)");
          }
          small_mempool_create_groups(alloc,psVar15,pool + -1);
          psVar15 = pool;
          uVar10 = uVar2;
        }
        lVar9 = (long)(int)alloc->small_mempool_cache_size;
        uVar13 = alloc->small_mempool_cache_size + 1;
        alloc->small_mempool_cache_size = uVar13;
        uVar8 = alloc->objsize_max;
      } while ((uVar7 < uVar8) && (uVar14 = (ulong)uVar7, uVar13 < 0x400));
    }
    if ((psVar15->pool).slab_ptr_mask != alloc->small_mempool_cache[lVar9].pool.slab_ptr_mask) {
      __assert_fail("cur_order_pool->pool.slab_ptr_mask == last_pool->pool.slab_ptr_mask",
                    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/small/small.c"
                    ,0x121,"void small_mempool_create(struct small_alloc *)");
    }
    small_mempool_create_groups(alloc,psVar15,psVar1 + lVar9);
    alloc->objsize_max = uVar7;
    return;
  }
  __assert_fail("(granularity & (granularity - 1)) == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/small/small.c",
                0x134,
                "void small_alloc_create(struct small_alloc *, struct slab_cache *, uint32_t, unsigned int, float, float *)"
               );
}

Assistant:

void
small_alloc_create(struct small_alloc *alloc, struct slab_cache *cache,
		   uint32_t objsize_min, unsigned granularity,
		   float alloc_factor, float *actual_alloc_factor)
{
	alloc->cache = cache;
	/* Align sizes. */
	objsize_min = small_align(objsize_min, granularity);
	/* Make sure at least 4 largest objects can fit in a slab. */
	alloc->objsize_max =
		mempool_objsize_max(slab_order_size(cache, cache->order_max));
	alloc->objsize_max = small_align(alloc->objsize_max, granularity);

	assert((granularity & (granularity - 1)) == 0);
	assert(alloc_factor > 1. && alloc_factor <= 2.);

	alloc->factor = alloc_factor;
	/*
	 * Second parameter granularity, determines alignment.
	 */
	small_class_create(&alloc->small_class, granularity,
			   alloc->factor, objsize_min, actual_alloc_factor);
	small_mempool_create(alloc);
}